

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::RangeSelectSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,RangeSelectSyntax *this,size_t index)

{
  Token token;
  SyntaxNode *pSVar1;
  size_t index_local;
  RangeSelectSyntax *this_local;
  
  if (index == 0) {
    pSVar1 = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this->left)->super_SyntaxNode;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,pSVar1);
  }
  else if (index == 1) {
    token.kind = (this->range).kind;
    token._2_1_ = (this->range).field_0x2;
    token.numFlags.raw = (this->range).numFlags.raw;
    token.rawLen = (this->range).rawLen;
    token.info = (this->range).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 2) {
    pSVar1 = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this->right)->super_SyntaxNode;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,pSVar1);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax RangeSelectSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return left.get();
        case 1: return range;
        case 2: return right.get();
        default: return nullptr;
    }
}